

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

void __thiscall
CMU462::HalfedgeMesh::buildSubdivisionVertexList
          (HalfedgeMesh *this,
          vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *subDVertices)

{
  bool bVar1;
  Size SVar2;
  Size SVar3;
  Size SVar4;
  pointer pVVar5;
  pointer pVVar6;
  pointer pEVar7;
  pointer pEVar8;
  pointer pFVar9;
  reference pvVar10;
  HalfedgeMesh *in_RSI;
  FaceIter x_2;
  EdgeIter x_1;
  VertexIter x;
  Size size;
  HalfedgeMesh *in_stack_ffffffffffffff58;
  pointer in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff78;
  HalfedgeMesh *pHVar11;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *in_stack_ffffffffffffff80;
  _Self local_58;
  _Self local_50;
  _List_node_base *local_48;
  _Self local_40;
  _Self local_38;
  _List_node_base *local_30;
  _Self local_28;
  _Self local_20;
  long local_18;
  HalfedgeMesh *local_10;
  
  local_10 = in_RSI;
  SVar2 = nEdges((HalfedgeMesh *)0x2463f9);
  SVar3 = nFaces((HalfedgeMesh *)0x246408);
  SVar4 = nVertices((HalfedgeMesh *)0x246422);
  local_18 = SVar2 + SVar3 + SVar4;
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_20._M_node = (_List_node_base *)verticesBegin(in_stack_ffffffffffffff58);
  while( true ) {
    local_28._M_node = (_List_node_base *)verticesEnd(in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pVVar5 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_ffffffffffffff60);
    pHVar11 = local_10;
    pVVar6 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_ffffffffffffff60);
    pvVar10 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                        ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)pHVar11,
                         pVVar6->index);
    pvVar10->x = (pVVar5->newPosition).x;
    pvVar10->y = (pVVar5->newPosition).y;
    pvVar10->z = (pVVar5->newPosition).z;
    local_30 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_20,0);
  }
  local_38._M_node = (_List_node_base *)edgesBegin(in_stack_ffffffffffffff58);
  while( true ) {
    local_40._M_node = (_List_node_base *)edgesEnd(in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    pEVar7 = std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)0x246535)
    ;
    pHVar11 = local_10;
    pEVar8 = std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)0x246551)
    ;
    pvVar10 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                        ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)pHVar11,
                         pEVar8->index);
    pvVar10->x = (pEVar7->newPosition).x;
    pvVar10->y = (pEVar7->newPosition).y;
    pvVar10->z = (pEVar7->newPosition).z;
    local_48 = (_List_node_base *)std::_List_iterator<CMU462::Edge>::operator++(&local_38,0);
  }
  local_50._M_node = (_List_node_base *)facesBegin(in_stack_ffffffffffffff58);
  while( true ) {
    local_58._M_node = (_List_node_base *)facesEnd(in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    in_stack_ffffffffffffff60 =
         std::_List_iterator<CMU462::Face>::operator->
                   ((_List_iterator<CMU462::Face> *)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff58 = local_10;
    pFVar9 = std::_List_iterator<CMU462::Face>::operator->
                       ((_List_iterator<CMU462::Face> *)in_stack_ffffffffffffff60);
    pvVar10 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                        ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                         in_stack_ffffffffffffff58,pFVar9->index);
    pvVar10->x = (in_stack_ffffffffffffff60->newPosition).x;
    pvVar10->y = (in_stack_ffffffffffffff60->newPosition).y;
    pvVar10->z = (in_stack_ffffffffffffff60->newPosition).z;
    std::_List_iterator<CMU462::Face>::operator++(&local_50,0);
  }
  return;
}

Assistant:

void HalfedgeMesh::buildSubdivisionVertexList(vector<Vector3D>& subDVertices) {
	// TODO Resize the vertex list so that it can hold all the vertices.
	Size size = nEdges() + nFaces() + nVertices();
	subDVertices.resize(size);

	// TODO Iterate over vertices, assigning Vertex::newPosition to the
	// appropriate location in the new vertex list.
	for (VertexIter x = verticesBegin(); x != verticesEnd(); x++) {
		subDVertices[x->index] = x->newPosition;
	} 

	// TODO Iterate over edges, assigning Edge::newPosition to the appropriate
	// location in the new vertex list.
	for (EdgeIter x = edgesBegin(); x != edgesEnd(); x++) {
		subDVertices[x->index] = x->newPosition;
	}

	// TODO Iterate over faces, assigning Face::newPosition to the appropriate
	// location in the new vertex list.
	for (FaceIter x = facesBegin(); x != facesEnd(); x++) {
		subDVertices[x->index] = x->newPosition;
	}

	//showError("buildSubdivisionVertexList() not implemented.");
}